

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

char * parse_id(char *p,char **save)

{
  char cVar1;
  ushort **ppuVar2;
  union_tag *puVar3;
  long lVar4;
  ushort uVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  
  ppuVar2 = __ctype_b_loc();
  iVar6 = rescan_lineno;
  while( true ) {
    cVar1 = *p;
    lVar4 = (long)cVar1;
    uVar5 = (*ppuVar2)[lVar4];
    if ((uVar5 >> 0xd & 1) == 0) break;
    p = p + 1;
    if (cVar1 == '\n') {
      iVar6 = iVar6 + 1;
      rescan_lineno = iVar6;
    }
  }
  if ((cVar1 == '_') || ((uVar5 & 0x400) != 0)) {
    lVar7 = 0;
    while ((((uVar5 & 8) != 0 || ((char)lVar4 == '_')) || (((uint)lVar4 & 0xff) == 0x24))) {
      lVar4 = (long)p[lVar7 + 1];
      uVar5 = (*ppuVar2)[lVar4];
      lVar7 = lVar7 + 1;
    }
    pcVar8 = p + lVar7;
    if (save != (char **)0x0) {
      puVar3 = cache_tag(p,(int)lVar7);
      *save = puVar3->name;
    }
  }
  else {
    pcVar8 = (char *)0x0;
  }
  return pcVar8;
}

Assistant:

static char *parse_id(char *p, char **save)
{
char	*b;

    while (isspace(*p)) if (*p++ == '\n') rescan_lineno++;
    if (!isalpha(*p) && *p != '_') return 0;
    b = p;
    while (isalnum(*p) || *p == '_' || *p == '$') p++;
    if (save) {
	*save = cache_tag(b, p-b)->name; }
    return p;
}